

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O2

const_iterator __thiscall
frozen::unordered_set<frozen::basic_string<char>,3ul,frozen::elsa<void>,eq>::
find<std::__cxx11::string>
          (unordered_set<frozen::basic_string<char>,3ul,frozen::elsa<void>,eq> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  const_iterator this_00;
  bool bVar1;
  size_t sVar2;
  
  this_00 = (const_iterator)(this + 0x30);
  sVar2 = bits::pmh_tables<8ul,frozen::elsa<void>>::lookup<std::__cxx11::string,frozen::elsa<void>>
                    ((pmh_tables<8ul,frozen::elsa<void>> *)this_00,key,(elsa<void> *)this_00);
  if (sVar2 != 3) {
    bVar1 = eq::operator()((eq *)this,(string *)(this + sVar2 * 0x10),key);
    if (bVar1) {
      return (string *)(this + sVar2 * 0x10);
    }
  }
  return this_00;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    auto const pos = tables_.lookup(key, hash_function());
    auto it = keys_.begin() + pos;
    if (it != keys_.end() && key_eq()(*it, key))
      return it;
    else
      return keys_.end();
  }